

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

size_t __thiscall apngasm::APNGAsm::addFrame(APNGAsm *this,APNGFrame *frame)

{
  ulong uVar1;
  size_type sVar2;
  APNGFrame *frame_local;
  APNGAsm *this_local;
  
  uVar1 = (**(code **)(*(long *)this->_listener + 0x18))(this->_listener,frame);
  if ((uVar1 & 1) != 0) {
    std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::push_back
              (&this->_frames,frame);
    (**(code **)(*(long *)this->_listener + 0x28))(this->_listener,frame);
  }
  sVar2 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size(&this->_frames)
  ;
  return sVar2;
}

Assistant:

size_t APNGAsm::addFrame(const APNGFrame &frame)
  {
    if( _listener->onPreAddFrame(frame) )
    {
      _frames.push_back(frame);
      _listener->onPostAddFrame(frame);
    }
    return _frames.size();
  }